

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::Encode
          (IFF_ATC_NAVAIDS_FundamentalParameterData *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  IFF_ATC_NAVAIDS_FundamentalParameterData *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(float)this->m_f32ERP);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32Freq);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32PgRF);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32PulseWidth);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32BurstLength);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8AppMode);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding1);
  KDataStream::operator<<(pKVar1,this->m_ui8Padding2);
  return;
}

Assistant:

void IFF_ATC_NAVAIDS_FundamentalParameterData::Encode( KDataStream & stream ) const
{
    stream << m_f32ERP
           << m_f32Freq
           << m_f32PgRF
           << m_f32PulseWidth
           << m_ui32BurstLength
           << m_ui8AppMode
           << m_ui16Padding1
           << m_ui8Padding2;
}